

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Buffer::mix_samples(Blip_Buffer *this,blip_sample_t *in,long count)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (this->buffer_size_ != 1) {
    piVar1 = this->buffer_ + (ulong)*(ushort *)((long)&this->offset_ + 2) + 8;
    if (count == 0) {
      iVar3 = 0;
    }
    else {
      lVar2 = 0;
      lVar4 = 0;
      iVar3 = 0;
      do {
        iVar5 = piVar1[lVar4] - iVar3;
        iVar3 = in[lVar4] * 0x4000;
        piVar1[lVar4] = iVar5 + iVar3;
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + -4;
      } while (count != lVar4);
      piVar1 = (int *)((long)piVar1 - lVar2);
    }
    *piVar1 = *piVar1 - iVar3;
  }
  return;
}

Assistant:

void Blip_Buffer::mix_samples( blip_sample_t const* in, long count )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return;
	}
	
	buf_t_* out = buffer_ + (offset_ >> BLIP_BUFFER_ACCURACY) + blip_widest_impulse_ / 2;
	
	int const sample_shift = blip_sample_bits - 16;
	int prev = 0;
	while ( count-- )
	{
		blip_long s = (blip_long) *in++ << sample_shift;
		*out += s - prev;
		prev = s;
		++out;
	}
	*out -= prev;
}